

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>::
MatchAndExplain<std::array<solitaire::cards::Card,52ul>>
          (ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>> *this,
          array<solitaire::cards::Card,_52UL> *lhs,MatchResultListener *listener)

{
  bool bVar1;
  bool bVar2;
  const_reference __one;
  ostream *os_00;
  const_iterator pvVar3;
  const_iterator pvVar4;
  Card *pCVar5;
  ostream *poVar6;
  char *local_a0;
  Card *local_58;
  const_iterator it_1;
  const_iterator pvStack_48;
  bool printed_header2;
  const_iterator it;
  bool printed_header;
  ostream *os;
  StlContainerReference lhs_stl_container;
  MatchResultListener *listener_local;
  array<solitaire::cards::Card,_52UL> *lhs_local;
  ContainerEqMatcher<std::array<solitaire::cards::Card,_52UL>_> *this_local;
  
  __one = StlContainerView<std::array<solitaire::cards::Card,_52UL>_>::ConstReference(lhs);
  bVar2 = std::operator==(__one,(array<solitaire::cards::Card,_52UL> *)this);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    os_00 = MatchResultListener::stream(listener);
    if (os_00 != (ostream *)0x0) {
      bVar2 = false;
      for (pvStack_48 = std::array<solitaire::cards::Card,_52UL>::begin(__one);
          pvVar3 = std::array<solitaire::cards::Card,_52UL>::end(__one), pvStack_48 != pvVar3;
          pvStack_48 = pvStack_48 + 1) {
        pvVar3 = std::array<solitaire::cards::Card,_52UL>::begin
                           ((array<solitaire::cards::Card,_52UL> *)this);
        pvVar4 = std::array<solitaire::cards::Card,_52UL>::end
                           ((array<solitaire::cards::Card,_52UL> *)this);
        pCVar5 = ArrayAwareFind<solitaire::cards::Card_const*,solitaire::cards::Card>
                           (pvVar3,pvVar4,pvStack_48);
        pvVar3 = std::array<solitaire::cards::Card,_52UL>::end
                           ((array<solitaire::cards::Card,_52UL> *)this);
        if (pCVar5 == pvVar3) {
          if (bVar2) {
            std::operator<<(os_00,", ");
          }
          else {
            std::operator<<(os_00,"which has these unexpected elements: ");
            bVar2 = true;
          }
          UniversalPrint<solitaire::cards::Card>(pvStack_48,os_00);
        }
      }
      bVar1 = false;
      for (local_58 = std::array<solitaire::cards::Card,_52UL>::begin
                                ((array<solitaire::cards::Card,_52UL> *)this);
          pvVar3 = std::array<solitaire::cards::Card,_52UL>::end
                             ((array<solitaire::cards::Card,_52UL> *)this), local_58 != pvVar3;
          local_58 = local_58 + 1) {
        pvVar3 = std::array<solitaire::cards::Card,_52UL>::begin(__one);
        pvVar4 = std::array<solitaire::cards::Card,_52UL>::end(__one);
        pCVar5 = ArrayAwareFind<solitaire::cards::Card_const*,solitaire::cards::Card>
                           (pvVar3,pvVar4,local_58);
        pvVar3 = std::array<solitaire::cards::Card,_52UL>::end(__one);
        if (pCVar5 == pvVar3) {
          if (bVar1) {
            std::operator<<(os_00,", ");
          }
          else {
            if (bVar2) {
              local_a0 = ",\nand";
            }
            else {
              local_a0 = "which";
            }
            poVar6 = std::operator<<(os_00,local_a0);
            std::operator<<(poVar6," doesn\'t have these expected elements: ");
            bVar1 = true;
          }
          UniversalPrint<solitaire::cards::Card>(local_58,os_00);
        }
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }